

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O1

void FCanvasTextureInfo::EmptyList(void)

{
  FCanvasTextureInfo *pFVar1;
  FCanvasTextureInfo *pFVar2;
  
  pFVar2 = List;
  if (List != (FCanvasTextureInfo *)0x0) {
    do {
      pFVar1 = pFVar2->Next;
      (*(pFVar2->Texture->super_FTexture)._vptr_FTexture[9])();
      operator_delete(pFVar2,0x20);
      pFVar2 = pFVar1;
    } while (pFVar1 != (FCanvasTextureInfo *)0x0);
  }
  List = (FCanvasTextureInfo *)0x0;
  return;
}

Assistant:

void FCanvasTextureInfo::EmptyList ()
{
	FCanvasTextureInfo *probe, *next;

	for (probe = List; probe != NULL; probe = next)
	{
		next = probe->Next;
		probe->Texture->Unload();
		delete probe;
	}
	List = NULL;
}